

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b64b0::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  uint uVar1;
  PixelType PVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  float *pfVar9;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar10;
  ChannelList *this_00;
  ChannelList *pCVar11;
  uint *puVar12;
  reference pvVar13;
  Array2D<void_*> *pAVar14;
  void **ppvVar15;
  void *pvVar16;
  void *pvVar17;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  float fVar18;
  float fVar19;
  int f_2;
  int k_3;
  int j_5;
  int i_6;
  float *value_2;
  half *value_1;
  uint *value;
  uint l;
  int k_2;
  int j_4;
  int i_5;
  int f_1;
  int k_1;
  int j_3;
  int j_2;
  int y;
  int i_4;
  int f;
  int k;
  int j_1;
  int j;
  int i_3;
  string str_1;
  stringstream ss_1;
  int pointerSize_1;
  int sampleSize_1;
  PixelType type_1;
  int i_2;
  int pointerSize;
  int sampleSize;
  string str;
  stringstream ss;
  PixelType type;
  int i_1;
  int channels_added;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  int i;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int fillChannels;
  Array2D<unsigned_int> localSampleCount;
  int height;
  int width;
  Box2i *dataWindow;
  Header *fileHeader;
  DeepScanLineInputFile file;
  undefined4 uVar20;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff808;
  DeepFrameBuffer *in_stack_fffffffffffff810;
  long in_stack_fffffffffffff848;
  Array<Imf_3_2::Array2D<void_*>_> *in_stack_fffffffffffff850;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  uint local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  int local_530;
  int local_52c;
  DeepSlice local_528 [56];
  DeepSlice local_4f0 [32];
  stringstream local_4d0 [16];
  undefined1 local_4c0 [380];
  int local_344;
  int local_340;
  PixelType local_33c;
  int local_338;
  undefined4 local_334;
  DeepSlice local_330 [56];
  int local_2f8;
  int local_2f4;
  DeepSlice local_2f0 [32];
  stringstream local_2d0 [16];
  undefined1 local_2c0 [376];
  PixelType local_148;
  int local_144;
  int local_140;
  vector<int,_std::allocator<int>_> local_138;
  Slice local_120 [56];
  Slice local_e8 [108];
  int local_7c;
  Array local_78 [20];
  int local_64;
  Array2D<unsigned_int> local_60;
  int local_48;
  int local_44;
  int *local_40;
  undefined8 local_28;
  byte local_e;
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_c = in_ESI;
  if (local_e == 0) {
    poVar7 = std::operator<<((ostream *)&std::cout," reading all channels ");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout," reading random channels ");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  }
  pcVar8 = (char *)std::__cxx11::string::c_str();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&stack0xffffffffffffffe0,pcVar8,8);
  local_28 = Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::displayWindow();
  Imf_3_2::Header::displayWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  if (!bVar3) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x109,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  Imf_3_2::Header::dataWindow();
  Imf_3_2::Header::dataWindow();
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  if (!bVar3) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar9 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar18 = *pfVar9;
  pfVar9 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar18 != *pfVar9) || (NAN(fVar18) || NAN(*pfVar9))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  bVar3 = Imath_3_2::Vec2<float>::operator==(this,v);
  if (!bVar3) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar9 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar18 = *pfVar9;
  pfVar9 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar18 != *pfVar9) || (NAN(fVar18) || NAN(*pfVar9))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar10 = (int *)Imf_3_2::Header::lineOrder();
  iVar6 = *piVar10;
  piVar10 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar6 != *piVar10) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar10 = (int *)Imf_3_2::Header::compression();
  iVar6 = *piVar10;
  piVar10 = (int *)Imf_3_2::Header::compression();
  if (iVar6 == *piVar10) {
    this_00 = (ChannelList *)Imf_3_2::Header::channels();
    pCVar11 = (ChannelList *)Imf_3_2::Header::channels();
    bVar4 = Imf_3_2::ChannelList::operator==(this_00,pCVar11);
    if ((bVar4 & 1) == 0) {
      __assert_fail("fileHeader.channels () == header.channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                    ,0x110,
                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
    }
    Imf_3_2::Header::type_abi_cxx11_();
    Imf_3_2::Header::type_abi_cxx11_();
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    if (_Var5) {
      local_40 = (int *)Imf_3_2::Header::dataWindow();
      local_44 = (local_40[2] - *local_40) + 1;
      local_48 = (local_40[3] - local_40[1]) + 1;
      Imf_3_2::Array2D<unsigned_int>::Array2D(&local_60);
      Imf_3_2::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)in_stack_fffffffffffff810,(long)in_stack_fffffffffffff808,
                 CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      local_64 = random_int(in_stack_fffffffffffff7f4);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      for (local_7c = 0; local_7c < local_c + local_64; local_7c = local_7c + 1) {
        Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
        Imf_3_2::Array2D<void_*>::resizeErase
                  ((Array2D<void_*> *)in_stack_fffffffffffff810,(long)in_stack_fffffffffffff808,
                   CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      }
      Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff810);
      puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,0);
      uVar20 = 0;
      Imf_3_2::Slice::Slice
                (local_120,UINT,
                 (char *)(puVar12 + (-(long)*local_40 - (long)(local_40[1] * local_44))),4,
                 (long)local_44 << 2,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_e8);
      std::allocator<int>::allocator((allocator<int> *)0x181447);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff810,
                 (size_type)in_stack_fffffffffffff808,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      std::allocator<int>::~allocator((allocator<int> *)0x181473);
      local_140 = 0;
      for (local_144 = 0; local_144 < local_c; local_144 = local_144 + 1) {
        if ((local_e & 1) != 0) {
          iVar6 = random_int(in_stack_fffffffffffff7f4);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(long)local_144);
          *pvVar13 = iVar6;
        }
        if (((local_e & 1) == 0) ||
           (pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(long)local_144)
           , *pvVar13 == 1)) {
          local_148 = NUM_PIXELTYPES;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          if (*pvVar13 == 0) {
            local_148 = UINT;
          }
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          if (*pvVar13 == 1) {
            local_148 = HALF;
          }
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          if (*pvVar13 == 2) {
            local_148 = FLOAT;
          }
          std::__cxx11::stringstream::stringstream(local_2d0);
          std::ostream::operator<<(local_2c0,local_144);
          std::__cxx11::stringstream::str();
          local_2f4 = 0;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          if (*pvVar13 == 0) {
            local_2f4 = 4;
          }
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          if (*pvVar13 == 1) {
            local_2f4 = 2;
          }
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_144);
          PVar2 = local_148;
          if (*pvVar13 == 2) {
            local_2f4 = 4;
          }
          local_2f8 = 8;
          pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
          ppvVar15 = Imf_3_2::Array2D<void_*>::operator[](pAVar14 + local_144,0);
          in_stack_fffffffffffff800 = 0;
          uVar20 = 1;
          Imf_3_2::DeepSlice::DeepSlice
                    (local_330,PVar2,
                     (char *)(ppvVar15 + (-(long)*local_40 - (long)(local_40[1] * local_44))),
                     (long)local_2f8,(long)(local_2f8 * local_44),(long)local_2f4,1,1,0.0,false,
                     false);
          Imf_3_2::DeepFrameBuffer::insert((string *)local_e8,local_2f0);
          local_140 = local_140 + 1;
          std::__cxx11::string::~string((string *)local_2f0);
          std::__cxx11::stringstream::~stringstream(local_2d0);
        }
      }
      if (local_140 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
        local_334 = 1;
      }
      else {
        for (local_338 = 0; local_338 < local_64; local_338 = local_338 + 1) {
          local_33c = FLOAT;
          local_340 = 4;
          local_344 = 8;
          std::__cxx11::stringstream::stringstream(local_4d0);
          poVar7 = (ostream *)std::ostream::operator<<(local_4c0,local_338);
          std::operator<<(poVar7,"fill");
          std::__cxx11::stringstream::str();
          PVar2 = local_33c;
          pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
          ppvVar15 = Imf_3_2::Array2D<void_*>::operator[](pAVar14 + (local_338 + local_c),0);
          in_stack_fffffffffffff800 = 0;
          uVar20 = 1;
          Imf_3_2::DeepSlice::DeepSlice
                    (local_528,PVar2,
                     (char *)(ppvVar15 + (-(long)*local_40 - (long)(local_40[1] * local_44))),
                     (long)local_344,(long)(local_344 * local_44),(long)local_340,1,1,0.0,false,
                     false);
          Imf_3_2::DeepFrameBuffer::insert((string *)local_e8,local_4f0);
          std::__cxx11::string::~string((string *)local_4f0);
          std::__cxx11::stringstream::~stringstream(local_4d0);
        }
        Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&stack0xffffffffffffffe0);
        if ((local_d & 1) == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"per-line ");
          std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
          for (local_540 = 0; local_540 < (local_40[3] - local_40[1]) + 1; local_540 = local_540 + 1
              ) {
            Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&stack0xffffffffffffffe0);
            for (local_548 = 0; local_548 < local_44; local_548 = local_548 + 1) {
              puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
              uVar1 = puVar12[local_548];
              puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                  ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                   (long)local_540);
              if (uVar1 != puVar12[local_548]) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                              ,0x199,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (local_54c = 0; local_54c < local_44; local_54c = local_54c + 1) {
              for (local_550 = 0; local_550 < local_c; local_550 = local_550 + 1) {
                puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
                if ((puVar12[local_54c] == 0) ||
                   (((local_e & 1) != 0 &&
                    (pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&local_138,(long)local_550), *pvVar13 != 1)))) {
                  pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                  ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                       (pAVar14 + local_550,(long)local_540);
                  ppvVar15[local_54c] = (void *)0x0;
                }
                else {
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_550);
                  if (*pvVar13 == 0) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
                    pvVar16 = operator_new__((ulong)puVar12[local_54c] << 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_550,(long)local_540);
                    ppvVar15[local_54c] = pvVar16;
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_550);
                  if (*pvVar13 == 1) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
                    pvVar16 = operator_new__((ulong)puVar12[local_54c] * 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_550,(long)local_540);
                    ppvVar15[local_54c] = pvVar16;
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_550);
                  if (*pvVar13 == 2) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
                    pvVar16 = operator_new__((ulong)puVar12[local_54c] << 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_550,(long)local_540);
                    ppvVar15[local_54c] = pvVar16;
                  }
                }
              }
              for (local_554 = 0; local_554 < local_64; local_554 = local_554 + 1) {
                puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_540);
                pvVar16 = operator_new__((ulong)puVar12[local_54c] << 2);
                pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                     (pAVar14 + (local_554 + local_c),(long)local_540);
                ppvVar15[local_54c] = pvVar16;
              }
            }
            Imf_3_2::DeepScanLineInputFile::readPixels((int)&stack0xffffffffffffffe0);
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,"bulk ");
          std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
          Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
                    ((int)&stack0xffffffffffffffe0,local_40[1]);
          for (local_52c = 0; local_52c < (local_40[3] - local_40[1]) + 1; local_52c = local_52c + 1
              ) {
            for (local_530 = 0; local_530 < local_44; local_530 = local_530 + 1) {
              puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
              uVar1 = puVar12[local_530];
              puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                  ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                   (long)local_52c);
              if (uVar1 != puVar12[local_530]) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                              ,0x16f,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (local_534 = 0; local_534 < local_44; local_534 = local_534 + 1) {
              for (local_538 = 0; local_538 < local_c; local_538 = local_538 + 1) {
                puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
                if ((puVar12[local_534] == 0) ||
                   (((local_e & 1) != 0 &&
                    (pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&local_138,(long)local_538), *pvVar13 != 1)))) {
                  pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                  ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                       (pAVar14 + local_538,(long)local_52c);
                  ppvVar15[local_534] = (void *)0x0;
                }
                else {
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_538);
                  if (*pvVar13 == 0) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
                    pvVar16 = operator_new__((ulong)puVar12[local_534] << 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_538,(long)local_52c);
                    ppvVar15[local_534] = pvVar16;
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_538);
                  if (*pvVar13 == 1) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
                    pvVar16 = operator_new__((ulong)puVar12[local_534] * 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_538,(long)local_52c);
                    ppvVar15[local_534] = pvVar16;
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_538);
                  if (*pvVar13 == 2) {
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
                    pvVar16 = operator_new__((ulong)puVar12[local_534] << 2);
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_538,(long)local_52c);
                    ppvVar15[local_534] = pvVar16;
                  }
                }
              }
              for (local_53c = 0; local_53c < local_64; local_53c = local_53c + 1) {
                puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_60,(long)local_52c);
                pvVar16 = operator_new__((ulong)puVar12[local_534] << 2);
                pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                     (pAVar14 + (local_53c + local_c),(long)local_52c);
                ppvVar15[local_534] = pvVar16;
              }
            }
          }
          Imf_3_2::DeepScanLineInputFile::readPixels((int)&stack0xffffffffffffffe0,local_40[1]);
        }
        for (local_558 = 0; local_558 < local_48; local_558 = local_558 + 1) {
          for (local_55c = 0; local_55c < local_44; local_55c = local_55c + 1) {
            for (local_560 = 0; local_560 < local_c; local_560 = local_560 + 1) {
              if (((local_e & 1) == 0) ||
                 (pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_138,(long)local_560), *pvVar13 == 1)) {
                for (local_564 = 0;
                    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                        ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount
                                         ,(long)local_558), local_564 < puVar12[local_55c];
                    local_564 = local_564 + 1) {
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_560);
                  if (*pvVar13 == 0) {
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_560,(long)local_558);
                    pvVar16 = ppvVar15[local_55c];
                    if (*(uint *)((long)pvVar16 + (ulong)local_564 * 4) !=
                        (uint)(local_558 * local_44 + local_55c) % 0x801) {
                      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_55c);
                      poVar7 = std::operator<<(poVar7,", ");
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_558);
                      poVar7 = std::operator<<(poVar7," error, should be ");
                      poVar7 = (ostream *)
                               std::ostream::operator<<
                                         (poVar7,(local_558 * local_44 + local_55c) % 0x801);
                      poVar7 = std::operator<<(poVar7,", is ");
                      pvVar17 = (void *)std::ostream::operator<<
                                                  (poVar7,*(uint *)((long)pvVar16 +
                                                                   (ulong)local_564 * 4));
                      pvVar17 = (void *)std::ostream::operator<<
                                                  (pvVar17,std::endl<char,std::char_traits<char>>);
                      std::ostream::operator<<(pvVar17,std::flush<char,std::char_traits<char>>);
                    }
                    if (*(uint *)((long)pvVar16 + (ulong)local_564 * 4) !=
                        (uint)(local_558 * local_44 + local_55c) % 0x801) {
                      __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                    ,0x1d0,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_560);
                  if (*pvVar13 == 1) {
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_560,(long)local_558);
                    pvVar16 = ppvVar15[local_55c];
                    fVar18 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff7f4,uVar20));
                    fVar19 = (float)((local_558 * local_44 + local_55c) % 0x801);
                    if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
                      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_55c);
                      poVar7 = std::operator<<(poVar7,", ");
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_558);
                      poVar7 = std::operator<<(poVar7," error, should be ");
                      poVar7 = (ostream *)
                               std::ostream::operator<<
                                         (poVar7,(local_558 * local_44 + local_55c) % 0x801);
                      poVar7 = std::operator<<(poVar7,", is ");
                      pvVar16 = (void *)::operator<<(poVar7,(half)*(uint16_t *)
                                                                   ((long)pvVar16 +
                                                                   (ulong)local_564 * 2));
                      pvVar16 = (void *)std::ostream::operator<<
                                                  (pvVar16,std::endl<char,std::char_traits<char>>);
                      std::ostream::operator<<(pvVar16,std::flush<char,std::char_traits<char>>);
                    }
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    Imf_3_2::Array2D<void_*>::operator[](pAVar14 + local_560,(long)local_558);
                    fVar18 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff7f4,uVar20));
                    fVar19 = (float)((local_558 * local_44 + local_55c) % 0x801);
                    if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
                      __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                    ,0x1dc,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_560);
                  if (*pvVar13 == 2) {
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_560,(long)local_558);
                    pvVar16 = ppvVar15[local_55c];
                    fVar18 = *(float *)((long)pvVar16 + (ulong)local_564 * 4);
                    fVar19 = (float)((local_558 * local_44 + local_55c) % 0x801);
                    if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
                      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_55c);
                      poVar7 = std::operator<<(poVar7,", ");
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_558);
                      poVar7 = std::operator<<(poVar7," error, should be ");
                      poVar7 = (ostream *)
                               std::ostream::operator<<
                                         (poVar7,(local_558 * local_44 + local_55c) % 0x801);
                      poVar7 = std::operator<<(poVar7,", is ");
                      pvVar16 = (void *)std::ostream::operator<<
                                                  (poVar7,*(float *)((long)pvVar16 +
                                                                    (ulong)local_564 * 4));
                      pvVar16 = (void *)std::ostream::operator<<
                                                  (pvVar16,std::endl<char,std::char_traits<char>>);
                      std::ostream::operator<<(pvVar16,std::flush<char,std::char_traits<char>>);
                    }
                    pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                    ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar14 + local_560,(long)local_558);
                    fVar18 = *(float *)((long)ppvVar15[local_55c] + (ulong)local_564 * 4);
                    fVar19 = (float)((local_558 * local_44 + local_55c) % 0x801);
                    if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
                      __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                    ,0x1e8,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
        for (local_58c = 0; local_58c < local_48; local_58c = local_58c + 1) {
          for (local_590 = 0; local_590 < local_44; local_590 = local_590 + 1) {
            for (local_594 = 0; local_594 < local_c; local_594 = local_594 + 1) {
              if (((local_e & 1) == 0) ||
                 (pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_138,(long)local_594), *pvVar13 == 1)) {
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_594);
                if (*pvVar13 == 0) {
                  pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                  ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                       (pAVar14 + local_594,(long)local_58c);
                  if (ppvVar15[local_590] != (void *)0x0) {
                    operator_delete__(ppvVar15[local_590]);
                  }
                }
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_594);
                if (*pvVar13 == 1) {
                  pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                  ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                       (pAVar14 + local_594,(long)local_58c);
                  if (ppvVar15[local_590] != (void *)0x0) {
                    operator_delete__(ppvVar15[local_590]);
                  }
                }
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_594);
                if (*pvVar13 == 2) {
                  pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
                  ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                       (pAVar14 + local_594,(long)local_58c);
                  if (ppvVar15[local_590] != (void *)0x0) {
                    operator_delete__(ppvVar15[local_590]);
                  }
                }
              }
            }
            for (local_598 = 0; local_598 < local_64; local_598 = local_598 + 1) {
              pAVar14 = Imf_3_2::Array::operator_cast_to_Array2D_(local_78);
              ppvVar15 = Imf_3_2::Array2D<void_*>::operator[]
                                   (pAVar14 + (local_598 + local_c),(long)local_58c);
              in_stack_fffffffffffff810 = (DeepFrameBuffer *)ppvVar15[local_590];
              if (in_stack_fffffffffffff810 != (DeepFrameBuffer *)0x0) {
                operator_delete__(in_stack_fffffffffffff810);
              }
            }
          }
        }
        local_334 = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x182ee0);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array
                ((Array<Imf_3_2::Array2D<void_*>_> *)in_stack_fffffffffffff810);
      Imf_3_2::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff7f4,uVar20));
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile
                ((DeepScanLineInputFile *)&stack0xffffffffffffffe0);
      return;
    }
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  __assert_fail("fileHeader.compression () == header.compression ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                ,0x10f,"void (anonymous namespace)::readFile(const std::string &, int, bool, bool)")
  ;
}

Assistant:

void
readFile (
    const std::string& filename,
    int                channelCount,
    bool               bulkRead,
    bool               randomChannels)
{
    if (randomChannels) { cout << " reading random channels " << flush; }
    else
    {
        cout << " reading all channels " << flush;
    }

    DeepScanLineInputFile file (filename.c_str (), 8);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());

    const Box2i& dataWindow = fileHeader.dataWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&localSampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
        sizeof (unsigned int) * 1,       // xStride// 9
        sizeof (unsigned int) * width)); // yStride// 10

    vector<int> read_channel (channelCount);

    int channels_added = 0;

    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str, // name // 6
                DeepSlice (
                    type, // type // 7
                    (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
                    pointerSize * 1,     // xStride// 9
                    pointerSize * width, // yStride// 10
                    sampleSize));        // sampleStride
            channels_added++;
        }
    }

    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }
        }

        file.readPixels (dataWindow.min.y, dataWindow.max.y);
    }

    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts (y);

            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }

            file.readPixels (y);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value =
                                (unsigned int*) (data[k][i][j]);
                            if (value[l] !=
                                static_cast<unsigned int> (i * width + j) %
                                    2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                value[l] ==
                                static_cast<unsigned int> (i * width + j) %
                                    2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((half*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((float*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    if (channelTypes[k] == 0)
                        delete[](unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                    if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
                }
            }
            for (int f = 0; f < fillChannels; ++f)
            {
                delete[](float*) data[f + channelCount][i][j];
            }
        }
}